

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O0

void scm::sweep(void)

{
  bool bVar1;
  ObjectTypeTag OVar2;
  Verbosity VVar3;
  size_type sVar4;
  reference ppCVar5;
  ObjectTypeTag tag;
  ObjectTypeTag tag_00;
  Object *obj;
  Object *obj_00;
  double dVar6;
  double __x;
  int nObjectsAfter;
  byte local_a9;
  string local_a8;
  const_iterator local_88;
  Collectable **local_80;
  byte local_75;
  string local_68;
  byte local_41;
  string local_40;
  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
  local_20;
  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
  local_18;
  iterator i;
  int nObjectsBefore;
  
  sVar4 = std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>::size
                    ((vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_> *)ObjectHeap);
  i._M_current._4_4_ = (undefined4)sVar4;
  local_18._M_current =
       (Collectable **)
       std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>::begin
                 ((vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_> *)ObjectHeap);
  while( true ) {
    local_20._M_current =
         (Collectable **)
         std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>::end
                   ((vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_> *)ObjectHeap);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
              ::operator*(&local_18);
    if ((((*ppCVar5)->marked & 1U) == 0) &&
       (ppCVar5 = __gnu_cxx::
                  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                  ::operator*(&local_18), ((*ppCVar5)->essential & 1U) == 0)) {
      VVar3 = loguru::current_verbosity_cutoff();
      local_41 = 0;
      local_75 = 0;
      if ((-1 < VVar3) && ((LOG_GARBAGE_COLLECTION & 1) != 0)) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                  ::operator*(&local_18);
        OVar2 = getTag((Object *)*ppCVar5);
        tagToString_abi_cxx11_(&local_40,(scm *)(ulong)OVar2,tag);
        local_41 = 1;
        std::__cxx11::string::c_str();
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                  ::operator*(&local_18);
        toString_abi_cxx11_(&local_68,(scm *)*ppCVar5,obj);
        local_75 = 1;
        dVar6 = (double)std::__cxx11::string::c_str();
        loguru::log(dVar6);
      }
      if ((local_75 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_68);
      }
      if ((local_41 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_40);
      }
      __gnu_cxx::
      __normal_iterator<scm::Collectable*const*,std::vector<scm::Collectable*,std::allocator<scm::Collectable*>>>
      ::__normal_iterator<scm::Collectable**>
                ((__normal_iterator<scm::Collectable*const*,std::vector<scm::Collectable*,std::allocator<scm::Collectable*>>>
                  *)&local_88,&local_18);
      local_80 = (Collectable **)
                 std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>::erase
                           ((vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_> *)
                            ObjectHeap,local_88);
      local_18._M_current = local_80;
    }
    else {
      VVar3 = loguru::current_verbosity_cutoff();
      local_a9 = 0;
      bVar1 = false;
      if ((-1 < VVar3) && ((LOG_GARBAGE_COLLECTION & 1) != 0)) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                  ::operator*(&local_18);
        tagToString_abi_cxx11_(&local_a8,(scm *)(ulong)*(uint *)&(*ppCVar5)->field_0x14,tag_00);
        local_a9 = 1;
        std::__cxx11::string::c_str();
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                  ::operator*(&local_18);
        toString_abi_cxx11_((string *)&nObjectsAfter,(scm *)*ppCVar5,obj_00);
        bVar1 = true;
        dVar6 = (double)std::__cxx11::string::c_str();
        loguru::log(dVar6);
      }
      if (bVar1) {
        std::__cxx11::string::~string((string *)&nObjectsAfter);
      }
      if ((local_a9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a8);
      }
      ppCVar5 = __gnu_cxx::
                __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
                ::operator*(&local_18);
      (*ppCVar5)->marked = false;
      __gnu_cxx::
      __normal_iterator<scm::Collectable_**,_std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>_>
      ::operator++(&local_18);
    }
  }
  std::vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_>::size
            ((vector<scm::Collectable_*,_std::allocator<scm::Collectable_*>_> *)ObjectHeap);
  VVar3 = loguru::current_verbosity_cutoff();
  if ((-2 < VVar3) && ((LOG_GARBAGE_COLLECTION & 1) != 0)) {
    loguru::log(__x);
  }
  return;
}

Assistant:

void sweep()
{
  int nObjectsBefore{static_cast<int>(ObjectHeap.size())};
  for (auto i = ObjectHeap.begin(); i != ObjectHeap.end();) {
    if (!(*i)->marked && !(*i)->essential) {
      DLOG_IF_F(INFO,
                LOG_GARBAGE_COLLECTION,
                "delete %s %s",
                tagToString(getTag((Object*)(*i))).c_str(),
                toString((Object*)(*i)).c_str());
      // TODO: this doesn't seem to work yet -> no deleting as of yet :)
      // delete *i;
      i = ObjectHeap.erase(i);
    }
    else {
      DLOG_IF_F(INFO,
                LOG_GARBAGE_COLLECTION,
                "keep %s %s",
                tagToString(((Object*)(*i))->tag).c_str(),
                toString((Object*)(*i)).c_str());
      (*i)->marked = false;
      ++i;
    }
  }
  int nObjectsAfter{static_cast<int>(ObjectHeap.size())};
  DLOG_IF_F(WARNING,
            LOG_GARBAGE_COLLECTION,
            "cleaned up %d/%d objects",
            nObjectsBefore - nObjectsAfter,
            nObjectsBefore);
}